

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_ineq.h
# Opt level: O3

void __thiscall
mp::
Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>
::ConvertCondIneq<1>
          (Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>
           *this,ItemType *cc,int value,double eps)

{
  double *pdVar1;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  double dVar2;
  NodeRange nr;
  undefined1 local_318 [72];
  ptr local_2d0;
  ulong local_2c8;
  undefined1 local_2a0 [72];
  ptr local_258;
  ulong local_250;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_228;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_188;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_e8;
  
  var = (cc->
        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
        ).super_FunctionalConstraint.result_var_;
  if (*(size_ty *)
       ((long)&(cc->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
               .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data + 0x10) == 0) {
    dVar2 = 0.0;
    if (0.0 < eps + (cc->
                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                    ).
                    super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                    .args_.super_AlgConRhs<2>.rhs_) {
      if (value == 0) {
        dVar2 = 1.0;
      }
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)(this->
                           super_BasicFuncConstrCvt<mp::Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                           ).
                           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                           .mdl_cvt_,var,dVar2,dVar2);
      return;
    }
  }
  else {
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this->
                 super_BasicFuncConstrCvt<mp::Cond_LE_LT_GT_GE_Converter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ).
                 super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 .mdl_cvt_;
    dVar2 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[var];
    pdVar1 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + var;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)local_318,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  .args_.super_LinTerms);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_2d0,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  .args_.super_LinTerms.vars_);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_228,(LinTerms *)local_318,
                 (AlgConRhs<1>)
                 (eps + (cc->
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                        ).
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                        .args_.super_AlgConRhs<2>.rhs_),true);
      IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
      IndicatorConstraint(&local_e8,var,value,&local_228);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
      ::
      AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  *)this_00,&local_e8);
      if (6 < local_e8.con_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
              m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_e8.con_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_e8.con_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_e8.con_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_e8.con_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_e8.con_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.con_.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_e8.con_.super_BasicConstraint.name_.field_2) {
        operator_delete(local_e8.con_.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_e8.con_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_e8.super_BasicConstraint.name_.field_2) {
        operator_delete(local_e8.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_e8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_228.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
              .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_228.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_228.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_228.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_228.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_228.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_228.super_BasicConstraint.name_.field_2) {
        operator_delete(local_228.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_228.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_2c8) {
        operator_delete(local_2d0,local_2c8 << 2);
      }
    }
    else {
      if (dVar2 != (double)value) {
        return;
      }
      if (NAN(dVar2) || NAN((double)value)) {
        return;
      }
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)local_2a0,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  .args_.super_LinTerms);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_258,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                  .args_.super_LinTerms.vars_);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_188,(LinTerms *)local_2a0,
                 (AlgConRhs<1>)
                 (eps + (cc->
                        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                        ).
                        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>_>
                        .args_.super_AlgConRhs<2>.rhs_),true);
      nr = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                     ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)this_00,&local_188);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink(this_00,nr);
      if (6 < local_188.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
              .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_188.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_188.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_188.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_188.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_188.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_188.super_BasicConstraint.name_.field_2) {
        operator_delete(local_188.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_188.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      local_318._0_8_ = local_2a0._0_8_;
      local_318._8_8_ = local_2a0._8_8_;
      if (6 < local_250) {
        operator_delete(local_258,local_250 << 2);
        local_318._0_8_ = local_2a0._0_8_;
        local_318._8_8_ = local_2a0._8_8_;
      }
    }
    if (6 < (ulong)local_318._8_8_) {
      operator_delete((void *)local_318._0_8_,local_318._8_8_ << 3);
    }
  }
  return;
}

Assistant:

void ConvertCondIneq(const ItemType& cc, int value, double eps) {
    const auto& con = cc.GetConstraint();
    const auto res = cc.GetResultVar();
    using AlgConOutput = AlgebraicConstraint<
      typename AlgCon::BodyType, AlgConRhs<kind> >;
    if (con.empty()) {                    // empty body
      if (kind*(con.rhs() + eps) > 0.0)
        GetMC().NarrowVarBounds(res, !value, !value);    // fix result
    } else {
      if (GetMC().is_fixed(res)) {
        if (value==GetMC().fixed_value(res)) { // result already fixed,
          GetMC().AddConstraint(               // add static constraint
                AlgConOutput{ con.GetBody(), con.rhs()+eps } );
        }                                      // otherwise, forget
      } else {
        GetMC().AddConstraint( IndicatorConstraint< AlgConOutput >(
                                res, value,
                                { con.GetBody(), con.rhs()+eps }));
      }
    }
  }